

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeInternalForces
          (ChElementTetraCorot_10 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  ChMatrixDynamic<> *lhs;
  double dVar2;
  pointer psVar3;
  element_type *peVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Index IVar31;
  ChVectorDynamic<> *pCVar32;
  int iVar33;
  uint uVar34;
  Index size;
  DstEvaluatorType dstEvaluator;
  char *__function;
  ActualDstType actualDst;
  ulong uVar35;
  long lVar36;
  double *pdVar37;
  uint uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ChVectorDynamic<> FiK_local;
  ChVectorDynamic<> displ;
  ChVectorDynamic<> FiR_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  undefined1 local_f8 [40];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_d0;
  Index IStack_c8;
  Index local_c0;
  double local_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_a8;
  long local_88;
  ulong local_80;
  double local_78;
  double local_70;
  ChMatrixDynamic<> *local_68;
  ChVectorDynamic<> *local_60;
  ChMatrixRef local_58;
  
  lVar36 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  iVar33 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])();
  if (lVar36 != iVar33) {
    __assert_fail("Fi.size() == GetNdofs()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_10.cpp"
                  ,0x24a,
                  "virtual void chrono::fea::ChElementTetraCorot_10::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  iVar33 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,(long)iVar33);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[9])(this,&local_108);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != local_108.m_storage.m_rows) goto LAB_006ab433;
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_118,
             (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
  uVar39 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
  if (local_118.m_storage.m_rows != uVar39) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,uVar39,1);
    uVar39 = local_118.m_storage.m_rows;
  }
  lhs = &this->StiffnessMatrix;
  if (-1 < (long)uVar39) {
    if (uVar39 != 0) {
      memset(local_118.m_storage.m_data,0,uVar39 << 3);
    }
    local_f8._0_8_ = 0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_118,lhs,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_108,(Scalar *)local_f8);
    IVar31 = local_108.m_storage.m_rows;
    pdVar37 = local_108.m_storage.m_data;
    local_60 = Fi;
    if (local_108.m_storage.m_rows < 3) goto LAB_006ab414;
    psVar3 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar38 = 3;
    peVar4 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    auVar40._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar40);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar56._8_8_ = dVar2;
    auVar56._0_8_ = dVar2;
    auVar41._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar41);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar46._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar46._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar56,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar46,auVar46,1);
    local_f8._16_8_ =
         auVar46._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)local_108.m_storage.m_data & 7) == 0) {
      uVar34 = -((uint)((ulong)local_108.m_storage.m_data >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aaa34;
    }
    else {
LAB_006aaa34:
      memcpy(local_108.m_storage.m_data,local_f8,(ulong)(uVar38 * 8));
    }
    uVar39 = IVar31 - 3;
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar37 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    local_68 = lhs;
    if (uVar39 < 3) goto LAB_006ab414;
    peVar4 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 3;
    uVar38 = 3;
    auVar13._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar13._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar13);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar57._8_8_ = dVar2;
    auVar57._0_8_ = dVar2;
    auVar14._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar14._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar14);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar47._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar47._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar57,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar47,auVar47,1);
    local_f8._16_8_ =
         auVar47._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aaafe;
    }
    else {
LAB_006aaafe:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 6) goto LAB_006ab414;
    peVar4 = psVar3[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 6;
    uVar38 = 3;
    auVar15._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar15._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar15);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar58._8_8_ = dVar2;
    auVar58._0_8_ = dVar2;
    auVar16._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar16._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar16);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar48._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar48._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar58,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar48,auVar48,1);
    local_f8._16_8_ =
         auVar48._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aabc0;
    }
    else {
LAB_006aabc0:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 9) goto LAB_006ab414;
    peVar4 = psVar3[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 9;
    uVar38 = 3;
    auVar17._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar17._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar17);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar59._8_8_ = dVar2;
    auVar59._0_8_ = dVar2;
    auVar18._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar18._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar18);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar49._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar49._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar59,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar49,auVar49,1);
    local_f8._16_8_ =
         auVar49._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aac82;
    }
    else {
LAB_006aac82:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 0xc) goto LAB_006ab414;
    peVar4 = psVar3[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 0xc;
    uVar38 = 3;
    auVar19._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar19._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar19);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar60._8_8_ = dVar2;
    auVar60._0_8_ = dVar2;
    auVar20._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar20._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar20);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar50._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar50._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar60,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar50,auVar50,1);
    local_f8._16_8_ =
         auVar50._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aad44;
    }
    else {
LAB_006aad44:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 0xf) goto LAB_006ab414;
    peVar4 = psVar3[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 0xf;
    uVar38 = 3;
    auVar21._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar21._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar21);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar61._8_8_ = dVar2;
    auVar61._0_8_ = dVar2;
    auVar22._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar22._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar22);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar51._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar51._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar61,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar51,auVar51,1);
    local_f8._16_8_ =
         auVar51._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aae06;
    }
    else {
LAB_006aae06:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 0x12) goto LAB_006ab414;
    peVar4 = psVar3[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 0x12;
    uVar38 = 3;
    auVar23._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar23._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar23);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar62._8_8_ = dVar2;
    auVar62._0_8_ = dVar2;
    auVar24._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar24._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar24);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar52._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar52._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar62,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar52,auVar52,1);
    local_f8._16_8_ =
         auVar52._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aaecb;
    }
    else {
LAB_006aaecb:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 0x15) goto LAB_006ab414;
    peVar4 = psVar3[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 0x15;
    uVar38 = 3;
    auVar25._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar25._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar25);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar63._8_8_ = dVar2;
    auVar63._0_8_ = dVar2;
    auVar26._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar26._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar26);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar53._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar53._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar63,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar53,auVar53,1);
    local_f8._16_8_ =
         auVar53._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006aaf90;
    }
    else {
LAB_006aaf90:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 0x18) goto LAB_006ab414;
    peVar4 = psVar3[8].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar1 = pdVar37 + 0x18;
    uVar38 = 3;
    auVar27._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar27._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar27);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar64._8_8_ = dVar2;
    auVar64._0_8_ = dVar2;
    auVar28._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar28._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar28);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar54._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar54._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar64,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar54,auVar54,1);
    local_f8._16_8_ =
         auVar54._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar1 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006ab058;
    }
    else {
LAB_006ab058:
      memcpy(pdVar1,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar35 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar1 + uVar35),local_f8 + uVar35,0x18 - uVar35);
    }
    if (uVar39 < 0x1b) {
LAB_006ab414:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    peVar4 = psVar3[9].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pdVar37 = pdVar37 + 0x1b;
    uVar38 = 3;
    auVar29._8_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar29._0_8_ = *(undefined8 *)&peVar4->field_0x38;
    auVar40 = vmulpd_avx512vl(*(undefined1 (*) [16])
                               (this->super_ChElementCorotational).A.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,auVar29);
    dVar2 = *(double *)&peVar4->field_0x48;
    auVar65._8_8_ = dVar2;
    auVar65._0_8_ = dVar2;
    auVar30._8_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar30._0_8_ = *(undefined8 *)&peVar4->field_0x40;
    auVar41 = vfmadd231pd_avx512vl
                        (auVar40,*(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 3),auVar30);
    auVar40 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar55._0_8_ = auVar40._0_8_ * *(double *)&peVar4->field_0x38;
    auVar55._8_8_ = auVar40._8_8_ * *(double *)&peVar4->field_0x40;
    local_f8._0_16_ =
         vfmadd231pd_fma(auVar41,auVar65,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    auVar40 = vshufpd_avx(auVar55,auVar55,1);
    local_f8._16_8_ =
         auVar55._0_8_ +
         auVar40._0_8_ +
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    if (((ulong)pdVar37 & 7) == 0) {
      uVar34 = -((uint)((ulong)pdVar37 >> 3) & 0x1fffffff) & 7;
      if (uVar34 < 3) {
        uVar38 = uVar34;
      }
      if (uVar34 != 0) goto LAB_006ab121;
    }
    else {
LAB_006ab121:
      memcpy(pdVar37,local_f8,(ulong)(uVar38 * 8));
    }
    if (uVar38 < 3) {
      uVar39 = (ulong)(uVar38 << 3);
      memcpy((void *)((long)pdVar37 + uVar39),local_f8 + uVar39,0x18 - uVar39);
    }
    local_70 = this->Volume;
    local_78 = (((this->Material).
                 super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->super_ChContinuumMaterial).density;
    iVar33 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[3])(this);
    pCVar32 = local_60;
    lVar36 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
    if (lVar36 != local_108.m_storage.m_rows) {
LAB_006ab433:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    if (lVar36 < 0) {
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_006ab49d;
    }
    if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_rows != lVar36) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    local_b0 = (local_78 * local_70) / (double)iVar33;
    local_f8._24_8_ =
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    local_f8._8_8_ = lVar36;
    local_f8._32_8_ = local_68;
    local_d0 = &local_108;
    local_c0 = lVar36;
    local_a8 = local_d0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_88,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                *)local_f8);
    if (local_118.m_storage.m_rows != local_80) {
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    uVar39 = local_118.m_storage.m_rows + 7;
    if (-1 < local_118.m_storage.m_rows) {
      uVar39 = local_118.m_storage.m_rows;
    }
    uVar39 = uVar39 & 0xfffffffffffffff8;
    if (7 < local_118.m_storage.m_rows) {
      lVar36 = 0;
      do {
        auVar42 = vaddpd_avx512f(*(undefined1 (*) [64])(local_88 + lVar36 * 8),
                                 *(undefined1 (*) [64])(local_118.m_storage.m_data + lVar36));
        *(undefined1 (*) [64])(local_118.m_storage.m_data + lVar36) = auVar42;
        lVar36 = lVar36 + 8;
      } while (lVar36 < (long)uVar39);
    }
    if ((long)uVar39 < local_118.m_storage.m_rows) {
      do {
        local_118.m_storage.m_data[uVar39] =
             *(double *)(local_88 + uVar39 * 8) + local_118.m_storage.m_data[uVar39];
        uVar39 = uVar39 + 1;
      } while (local_118.m_storage.m_rows != uVar39);
    }
    if (-1 < local_118.m_storage.m_rows) {
      uVar39 = local_118.m_storage.m_rows & 0x7ffffffffffffff8;
      if (7 < (ulong)local_118.m_storage.m_rows) {
        auVar42 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        uVar35 = 0;
        do {
          auVar43 = vxorpd_avx512dq(auVar42,*(undefined1 (*) [64])
                                             (local_118.m_storage.m_data + uVar35));
          *(undefined1 (*) [64])(local_118.m_storage.m_data + uVar35) = auVar43;
          uVar35 = uVar35 + 8;
        } while (uVar35 < uVar39);
      }
      if ((long)uVar39 < local_118.m_storage.m_rows) {
        auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar43 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        auVar44 = vpbroadcastq_avx512f();
        uVar35 = 0;
        do {
          auVar45 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar45,auVar42);
          uVar12 = vpcmpuq_avx512f(auVar45,auVar44,2);
          pdVar37 = local_118.m_storage.m_data + uVar39 + uVar35;
          auVar45._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * (long)pdVar37[1];
          auVar45._0_8_ = (ulong)((byte)uVar12 & 1) * (long)*pdVar37;
          auVar45._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * (long)pdVar37[2];
          auVar45._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * (long)pdVar37[3];
          auVar45._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * (long)pdVar37[4];
          auVar45._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * (long)pdVar37[5];
          auVar45._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * (long)pdVar37[6];
          auVar45._56_8_ = (uVar12 >> 7) * (long)pdVar37[7];
          auVar45 = vxorpd_avx512dq(auVar45,auVar43);
          pdVar37 = local_118.m_storage.m_data + uVar39 + uVar35;
          bVar5 = (bool)((byte)uVar12 & 1);
          bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
          *pdVar37 = (double)((ulong)bVar5 * auVar45._0_8_ | (ulong)!bVar5 * (long)*pdVar37);
          pdVar37[1] = (double)((ulong)bVar6 * auVar45._8_8_ | (ulong)!bVar6 * (long)pdVar37[1]);
          pdVar37[2] = (double)((ulong)bVar7 * auVar45._16_8_ | (ulong)!bVar7 * (long)pdVar37[2]);
          pdVar37[3] = (double)((ulong)bVar8 * auVar45._24_8_ | (ulong)!bVar8 * (long)pdVar37[3]);
          pdVar37[4] = (double)((ulong)bVar9 * auVar45._32_8_ | (ulong)!bVar9 * (long)pdVar37[4]);
          pdVar37[5] = (double)((ulong)bVar10 * auVar45._40_8_ | (ulong)!bVar10 * (long)pdVar37[5]);
          pdVar37[6] = (double)((ulong)bVar11 * auVar45._48_8_ | (ulong)!bVar11 * (long)pdVar37[6]);
          pdVar37[7] = (double)((uVar12 >> 7) * auVar45._56_8_ |
                               (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar37[7]);
          uVar35 = uVar35 + 8;
        } while ((((uint)local_118.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar35);
      }
      local_c0 = 0;
      local_d0 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0;
      IStack_c8 = 0;
      local_f8._8_8_ = local_118.m_storage.m_rows;
      local_f8._0_8_ = local_118.m_storage.m_data;
      local_f8._16_8_ = 1;
      local_f8._24_8_ = 1;
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (pCVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value =
           (pCVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 1;
      if (-1 < local_58.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_rows.m_value ||
          local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data == (double *)0x0) {
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 1;
        ChMatrixCorotation::ComputeCK
                  ((ChMatrixConstRef)local_f8,&(this->super_ChElementCorotational).A,10,&local_58);
        if (local_d0 != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
          free(*(void **)((long)local_d0 + -8));
        }
        if (local_88 != 0) {
          free(*(void **)(local_88 + -8));
        }
        if (local_118.m_storage.m_data != (double *)0x0) {
          free((void *)local_118.m_storage.m_data[-1]);
        }
        if (local_108.m_storage.m_data != (double *)0x0) {
          free((void *)local_108.m_storage.m_data[-1]);
        }
        return;
      }
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                   );
    }
  }
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_006ab49d:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

void ChElementTetraCorot_10::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == GetNdofs());

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    // nodal speeds, local
    displ.segment(0, 3) = A.transpose() * nodes[0]->pos_dt.eigen();
    displ.segment(3, 3) = A.transpose() * nodes[1]->pos_dt.eigen();
    displ.segment(6, 3) = A.transpose() * nodes[2]->pos_dt.eigen();
    displ.segment(9, 3) = A.transpose() * nodes[3]->pos_dt.eigen();
    displ.segment(12, 3) = A.transpose() * nodes[4]->pos_dt.eigen();
    displ.segment(15, 3) = A.transpose() * nodes[5]->pos_dt.eigen();
    displ.segment(18, 3) = A.transpose() * nodes[6]->pos_dt.eigen();
    displ.segment(21, 3) = A.transpose() * nodes[7]->pos_dt.eigen();
    displ.segment(24, 3) = A.transpose() * nodes[8]->pos_dt.eigen();
    displ.segment(27, 3) = A.transpose() * nodes[9]->pos_dt.eigen();

    double lumped_node_mass = (GetVolume() * Material->Get_density()) / GetNnodes();
    ChVectorDynamic<> FiR_local =
        Material->Get_RayleighDampingK() * (StiffnessMatrix * displ + lumped_node_mass * displ);
    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 10, Fi);
}